

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O0

void __thiscall cmCTestRunScriptCommand::~cmCTestRunScriptCommand(cmCTestRunScriptCommand *this)

{
  cmCTestRunScriptCommand *this_local;
  
  ~cmCTestRunScriptCommand(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

cmCTestRunScriptCommand() {}